

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O3

auto_ptr<avro::InputStream> __thiscall
avro::istreamInputStream(avro *this,istream *is,size_t bufferSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR__BufferCopyIn_001ce910;
  puVar1[1] = is;
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = &PTR__BufferCopyInInputStream_001ce9e8;
  puVar2[1] = bufferSize;
  pvVar3 = operator_new__(bufferSize);
  puVar2[2] = pvVar3;
  puVar2[3] = puVar1;
  puVar2[4] = 0;
  puVar2[5] = pvVar3;
  puVar2[6] = 0;
  *(undefined8 **)this = puVar2;
  return (auto_ptr<avro::InputStream>)(InputStream *)this;
}

Assistant:

auto_ptr<InputStream> istreamInputStream(istream& is,
    size_t bufferSize)
{
    auto_ptr<BufferCopyIn> in(new IStreamBufferCopyIn(is));
    return auto_ptr<InputStream>( new BufferCopyInInputStream(in, bufferSize));
}